

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper::
RunImpl(initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *this)

{
  int64_t *this_00;
  Message *pMVar1;
  TestResults *this_01;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_228;
  UtcTimeStamp local_208;
  Logon local_1f0;
  undefined1 local_88 [8];
  UtcTimeStamp time;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *local_10;
  initiatorFixtureLogOnResponse_ReceivedResponseBeforeSendingLogOnRequestHelper *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  this_00 = &time.super_DateTime.m_time;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)this_00,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,
             (UtcTimeOnly *)this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)this_00);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_88);
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  createLogon(&local_1f0,"ISLD","TW",1);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_208);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&local_1f0,SUB81(&local_208,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_208);
  FIX42::Logon::~Logon(&local_1f0);
  bVar2 = FIX::Session::sentLogout((this->super_initiatorFixture).super_sessionFixture.object);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_01 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_228,*ppTVar4,0x7d9);
    UnitTest::TestResults::OnTestFailure(this_01,&local_228,"!object->sentLogout()");
  }
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_88);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOnResponse_ReceivedResponseBeforeSendingLogOnRequest) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  object->logon();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  CHECK(!object->sentLogout());
}